

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall exe_reconstructor::o32exe::appendexedata(o32exe *this,ByteVector *hdr)

{
  reference pvVar1;
  uint8_t *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  size_type sVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  uchar local_31;
  char *local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  reference local_20;
  uint8_t *p;
  ByteVector *hdr_local;
  o32exe *this_local;
  
  p = (uint8_t *)hdr;
  hdr_local = (ByteVector *)this;
  uVar3 = std::__cxx11::string::size();
  puVar2 = p;
  if (7 < uVar3) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "section name > 8 chars";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)p);
  sVar6 = size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)puVar2,sVar5 + sVar6);
  puVar2 = p;
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)p);
  sVar6 = size();
  local_20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)puVar2,
                        sVar5 - sVar6);
  local_28._M_current = (char *)std::__cxx11::string::begin();
  local_30 = (char *)std::__cxx11::string::end();
  std::copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_char*>
            (local_28,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_30,local_20);
  uVar3 = std::__cxx11::string::size();
  pvVar1 = local_20;
  if (uVar3 < 8) {
    lVar7 = std::__cxx11::string::size();
    lVar8 = std::__cxx11::string::size();
    local_31 = '\0';
    std::fill_n<unsigned_char*,unsigned_long,unsigned_char>(pvVar1 + lVar7,8 - lVar8,&local_31);
  }
  set32le<unsigned_char*>(local_20 + 8,this->vsize);
  set32le<unsigned_char*>(local_20 + 0xc,this->rva);
  set32le<unsigned_char*>(local_20 + 0x10,this->psize);
  set32le<unsigned_char*>(local_20 + 0x14,this->dataptr);
  set32le<unsigned_char*>(local_20 + 0x18,this->realaddr);
  set32le<unsigned_char*>(local_20 + 0x1c,this->access);
  set32le<unsigned_char*>(local_20 + 0x20,this->temp3);
  set32le<unsigned_char*>(local_20 + 0x24,this->flags);
  return;
}

Assistant:

void appendexedata(ByteVector& hdr)
        {
            if (name.size()>=8)
                throw "section name > 8 chars";

            hdr.resize(hdr.size()+o32exe::size());
            uint8_t *p= &hdr[hdr.size()-o32exe::size()];
            std::copy(name.begin(), name.end(), p);
            if (name.size()<8)
                std::fill_n(p+name.size(), 8-name.size(), uint8_t(0));

            set32le(p+0x0008, vsize);
            set32le(p+0x000c, rva);
            set32le(p+0x0010, psize);
            set32le(p+0x0014, dataptr);
            set32le(p+0x0018, realaddr);
            set32le(p+0x001c, access);
            set32le(p+0x0020, temp3);
            set32le(p+0x0024, flags);
        }